

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

omittable_field<std::array<int,_2UL>_> * __thiscall
discordpp::omittable_field<std::array<int,_2UL>_>::operator=
          (omittable_field<std::array<int,_2UL>_> *this)

{
  _Head_base<0UL,_std::array<int,_2UL>_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->super_field<std::array<int,_2UL>_>).t_._M_t.
       super___uniq_ptr_impl<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>._M_t
       .super__Tuple_impl<0UL,_std::array<int,_2UL>_*,_std::default_delete<std::array<int,_2UL>_>_>.
       super__Head_base<0UL,_std::array<int,_2UL>_*,_false>._M_head_impl;
  (this->super_field<std::array<int,_2UL>_>).t_._M_t.
  super___uniq_ptr_impl<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>._M_t.
  super__Tuple_impl<0UL,_std::array<int,_2UL>_*,_std::default_delete<std::array<int,_2UL>_>_>.
  super__Head_base<0UL,_std::array<int,_2UL>_*,_false>._M_head_impl = (array<int,_2UL> *)0x0;
  if (_Var1._M_head_impl != (array<int,_2UL> *)0x0) {
    operator_delete(_Var1._M_head_impl,8);
  }
  (this->super_field<std::array<int,_2UL>_>).s_ = omitted_e;
  return this;
}

Assistant:

virtual omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }